

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O1

maze_path * __thiscall
HBF::search(maze_path *__return_storage_ptr__,HBF *this,
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *grid,vector<double,_std::allocator<double>_> *start,
           vector<int,_std::allocator<int>_> *goal)

{
  maze_s *__src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  pointer pvVar4;
  pointer piVar5;
  double *pdVar6;
  pointer pvVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  maze_s state;
  bool bVar12;
  pointer pmVar13;
  pointer pmVar14;
  pointer pvVar15;
  long lVar16;
  ulong uVar17;
  ostream *poVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  initializer_list<HBF::maze_s> __l;
  maze_path *path;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> opened;
  maze_s state2;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> next_state;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  closed_value;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  closed;
  allocator_type local_191;
  maze_path *local_190;
  int local_188;
  allocator_type local_181;
  HBF *local_180;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_178;
  int local_15c;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  *local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  maze_s local_130;
  double local_110;
  vector<int,_std::allocator<int>_> *local_108;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_100;
  double local_f8;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  int local_bc;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_b8;
  double local_a0;
  long local_98;
  long local_90;
  double local_88;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  local_80;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  
  iVar25 = this->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar24 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  local_190 = __return_storage_ptr__;
  local_180 = this;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_b8,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_d8);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_130,(long)piVar5 - lVar24 >> 2,&local_b8,(allocator_type *)&local_178);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&local_80,(long)iVar25,(value_type *)&local_130,(allocator_type *)&local_f0);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_130);
  if (local_b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar25 = local_180->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar24 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_d8,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_178);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_130,(long)piVar5 - lVar24 >> 2,&local_d8,(allocator_type *)&local_f0);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)&local_b8,(long)iVar25,(value_type *)&local_130,&local_191);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_130);
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar25 = local_180->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar24 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_178,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_f0);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_130,(long)piVar5 - lVar24 >> 2,&local_178,(allocator_type *)&local_191);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            *)&local_d8,(long)iVar25,(value_type *)&local_130,&local_181);
  local_100 = grid;
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_130);
  if (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (maze_s *)0x0) {
    operator_delete(local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar27 = fmod((start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[2] + 6.283185307179586,6.283185307179586);
  iVar25 = local_180->NUM_THETA_CELLS;
  dVar27 = round((dVar27 * (double)iVar25) / 6.283185307179586);
  pvVar15 = local_80.
            super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pdVar6 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_a0 = *pdVar6;
  local_110 = pdVar6[1];
  lVar16 = (long)((int)dVar27 % iVar25);
  dVar27 = floor(local_a0);
  pvVar7 = pvVar15[lVar16].
           super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)(int)dVar27 * 0x18;
  dVar28 = floor(local_110);
  lVar24 = *(long *)&pvVar7[(int)dVar27].
                     super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                     super__Vector_impl_data;
  lVar21 = (long)(int)dVar28 * 0x20;
  *(undefined8 *)(lVar24 + lVar21) = 0;
  *(double *)(lVar24 + 8 + lVar21) = local_a0;
  *(double *)(lVar24 + 0x10 + lVar21) = local_110;
  *(undefined4 *)
   (*(long *)((long)(&(local_b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                       _M_impl.super__Vector_impl_data._M_start)->g)[lVar16 * 3] + lVar22) +
   (long)(int)dVar28 * 4) = 1;
  lVar24 = *(long *)(*(long *)(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar16 * 6) + lVar22);
  *(undefined8 *)(lVar24 + lVar21) = 0;
  *(double *)(lVar24 + 8 + lVar21) = local_a0;
  *(double *)(lVar24 + 0x10 + lVar21) = local_110;
  local_130.g = 0.0;
  local_130.x = local_a0;
  local_130.y = local_110;
  __l._M_len = 1;
  __l._M_array = &local_130;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_178,__l,(allocator_type *)&local_f0);
  local_158 = &local_190->came_from;
  local_15c = 1;
  pvVar26 = local_100;
  local_108 = goal;
  do {
    pmVar14 = local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pmVar13 = local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no valid path.",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&local_190->closed,&local_80);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(local_158,
                  (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                   *)&local_d8);
      (local_190->final).g = 0.0;
      (local_190->final).x = local_a0;
      (local_190->final).y = local_110;
      break;
    }
    uVar17 = (long)local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    lVar24 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<comparator>>
              (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,__gnu_cxx::__ops::_Iter_comp_iter<comparator>>
              (pmVar13,pmVar14);
    local_f8 = (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_start)->g;
    local_140 = (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_start)->x;
    local_148 = (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_start)->y;
    local_150 = (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_start)->theta;
    __src = local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
    if (__src != local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove(local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start,__src,
              (long)local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    iVar25 = (int)local_140;
    iVar23 = (int)local_148;
    piVar8 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((*piVar8 == iVar25) && (piVar8[1] == iVar23)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"found path to goal in ",0x16);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_15c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," expansions",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_190->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_190->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&local_190->closed,&local_80);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(local_158,
                  (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                   *)&local_d8);
      (local_190->final).g = local_f8;
      (local_190->final).x = local_140;
      (local_190->final).y = local_148;
      (local_190->final).theta = local_150;
      bVar12 = false;
    }
    else {
      local_50 = local_f8;
      dStack_48 = local_140;
      local_40 = local_148;
      dStack_38 = local_150;
      state.x = local_140;
      state.g = local_f8;
      state.y = local_148;
      state.theta = local_150;
      expand(&local_f0,local_180,state);
      if (local_f0.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f0.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_58 = local_150 + 6.283185307179586;
        lVar24 = 0;
        uVar17 = 0;
        local_188 = iVar25;
        local_bc = iVar23;
        do {
          piVar8 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar19 = iVar25 - *piVar8;
          iVar23 = -iVar19;
          if (0 < iVar19) {
            iVar23 = iVar19;
          }
          iVar20 = local_bc - piVar8[1];
          iVar19 = -iVar20;
          if (0 < iVar20) {
            iVar19 = iVar20;
          }
          local_138 = (double)iVar19 * (double)iVar19 + (double)iVar23 * (double)iVar23;
          dVar27 = fmod(local_58,6.283185307179586);
          iVar23 = local_180->NUM_THETA_CELLS;
          dVar27 = round((dVar27 * (double)iVar23) / 6.283185307179586);
          dVar27 = (double)(((int)dVar27 % iVar23) / 0xf);
          dVar27 = dVar27 * dVar27 + local_138;
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          dVar28 = *(double *)
                    ((long)&(local_f0.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                             _M_impl.super__Vector_impl_data._M_start)->x + lVar24);
          if (0.0 <= dVar28) {
            pvVar4 = (pvVar26->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar22 = ((long)(pvVar26->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                     -0x5555555555555555;
            auVar29._8_4_ = (int)((ulong)lVar22 >> 0x20);
            auVar29._0_8_ = lVar22;
            auVar29._12_4_ = 0x45300000;
            if (((dVar28 < (auVar29._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) &&
                (dVar3 = *(double *)
                          ((long)&(local_f0.
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->y + lVar24),
                0.0 <= dVar3)) &&
               (lVar22 = (long)*(pointer *)
                                ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + 8) -
                         *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data, lVar16 = lVar22 >> 2,
               auVar30._8_4_ = (int)(lVar22 >> 0x22), auVar30._0_8_ = lVar16,
               auVar30._12_4_ = 0x45300000,
               dVar3 < (auVar30._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0))) {
              local_68 = dVar27 + *(double *)
                                   ((long)&(local_f0.
                                            super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->g + lVar24);
              local_60 = *(double *)
                          ((long)&(local_f0.
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->theta + lVar24);
              local_138 = dVar28;
              local_88 = dVar3;
              dVar27 = fmod(local_60 + 6.283185307179586,6.283185307179586);
              iVar25 = local_180->NUM_THETA_CELLS;
              dVar27 = round((dVar27 * (double)iVar25) / 6.283185307179586);
              pmVar13 = local_b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar22 = (long)((int)dVar27 % iVar25);
              local_90 = lVar22;
              dVar27 = floor(local_138);
              lVar16 = (long)(int)dVar27;
              dVar27 = (&pmVar13->g)[lVar22 * 3];
              dVar28 = floor(local_88);
              pvVar26 = local_100;
              lVar22 = (long)(int)dVar28;
              goal = local_108;
              iVar25 = local_188;
              if ((*(int *)(*(long *)((long)dVar27 + lVar16 * 0x18) + lVar22 * 4) == 0) &&
                 (local_98 = lVar16,
                 *(int *)(*(long *)&(local_100->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar16].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + lVar22 * 4) == 0)) {
                local_130.g = local_68;
                local_130.x = local_138;
                local_130.y = local_88;
                local_130.theta = local_60;
                if (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>::
                  _M_realloc_insert<HBF::maze_s_const&>
                            ((vector<HBF::maze_s,std::allocator<HBF::maze_s>> *)&local_178,
                             (iterator)
                             local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_130);
                }
                else {
                  (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->y = local_88;
                  (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->theta = local_60;
                  (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->g = local_68;
                  (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->x = local_138;
                  local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                lVar16 = *(long *)&local_80.
                                   super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_90].
                                   super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_98].
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data;
                lVar21 = lVar22 * 0x20;
                puVar1 = (undefined8 *)
                         ((long)&(local_f0.
                                  super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->g + lVar24);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)
                         ((long)&(local_f0.
                                  super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->y + lVar24);
                uVar11 = puVar1[1];
                puVar2 = (undefined8 *)(lVar16 + 0x10 + lVar21);
                *puVar2 = *puVar1;
                puVar2[1] = uVar11;
                puVar1 = (undefined8 *)(lVar16 + lVar21);
                *puVar1 = uVar9;
                puVar1[1] = uVar10;
                *(undefined4 *)
                 (*(long *)((long)(&(local_b8.
                                     super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->g)[local_90 * 3] +
                           local_98 * 0x18) + lVar22 * 4) = 1;
                lVar22 = *(long *)(*(long *)(local_d8.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start + local_90 * 6
                                            ) + local_98 * 0x18);
                *(double *)(lVar22 + lVar21) = local_f8;
                *(double *)(lVar22 + 8 + lVar21) = local_140;
                *(double *)(lVar22 + 0x10 + lVar21) = local_148;
                *(double *)(lVar22 + 0x18 + lVar21) = local_150;
                local_15c = local_15c + 1;
                goal = local_108;
                iVar25 = local_188;
              }
            }
          }
          uVar17 = uVar17 + 1;
          lVar24 = lVar24 + 0x20;
        } while (uVar17 < (ulong)((long)local_f0.
                                        super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f0.
                                        super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (local_f0.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar12 = true;
    }
  } while (bVar12);
  if (local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (maze_s *)0x0) {
    operator_delete(local_178.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
             *)&local_d8);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)&local_b8);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_80);
  return local_190;
}

Assistant:

HBF::maze_path HBF::search(vector<vector<int> > grid, vector<double> start, vector<int> goal) {
    /*
    Working Implementation of breadth first search. Does NOT use a heuristic
    and as a result this is pretty inefficient. Try modifying this algorithm
    into hybrid A* by adding heuristics appropriately.
    */

    vector<vector<vector<maze_s> > > closed(NUM_THETA_CELLS,
                                            vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    vector<vector<vector<int> > > closed_value(NUM_THETA_CELLS,
                                               vector<vector<int>>(grid[0].size(), vector<int>(grid.size())));
    vector<vector<vector<maze_s> > > came_from(NUM_THETA_CELLS,
                                               vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    double theta = start[2];
    int stack = theta_to_stack_number(theta);
    double g = 0;

    maze_s state;
    state.g = g;
    state.x = start[0];
    state.y = start[1];

    closed[stack][idx(state.x)][idx(state.y)] = state;
    closed_value[stack][idx(state.x)][idx(state.y)] = 1;
    came_from[stack][idx(state.x)][idx(state.y)] = state;
    int total_closed = 1;
    vector<maze_s> opened = {state};
    bool finished = false;

    // add my heuristic function
    // If you have one h value per cell then multiple states in that cell will have the same g+h value,
    // making it difficult to determine which is the better state.

//    vector<vector<int> > heuristic = heuristic_basic(grid, start, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_euclidean(grid, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_manhattan(grid, goal);


    while (!opened.empty()) {

        int length = opened.size();
        sort(opened.begin(), opened.end(), comparator());


        maze_s next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next.x;
        int y = next.y;

        if (idx(x) == goal[0] && idx(y) == goal[1]) {
            cout << "found path to goal in " << total_closed << " expansions" << endl;
            maze_path path;
            path.closed = closed;
            path.came_from = came_from;
            path.final = next;
            return path;

        }
        vector<maze_s> next_state = expand(next);

        for (int i = 0; i < next_state.size(); i++) {
            double h;
//            h = heuristic[x][y];
            h = sqrt(pow(abs(x-goal[0]),2)+pow(abs(y-goal[1]),2)+pow(theta_to_stack_number(next.theta)/15,2));
//            h = 0;
            double g2 = next_state[i].g + h;
            double x2 = next_state[i].x;
            double y2 = next_state[i].y;
            double theta2 = next_state[i].theta;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }
            int stack2 = theta_to_stack_number(theta2);

            if (closed_value[stack2][idx(x2)][idx(y2)] == 0 && grid[idx(x2)][idx(y2)] == 0) {

                maze_s state2;
                state2.g = g2;
                state2.x = x2;
                state2.y = y2;
                state2.theta = theta2;

                opened.push_back(state2);

                closed[stack2][idx(x2)][idx(y2)] = next_state[i];
                closed_value[stack2][idx(x2)][idx(y2)] = 1;
                came_from[stack2][idx(x2)][idx(y2)] = next;
                total_closed += 1;
            }


        }

    }
    cout << "no valid path." << endl;
    HBF::maze_path path;
    path.closed = closed;
    path.came_from = came_from;
    path.final = state;
    return path;

}